

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_double<long_double>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  CharTraits<char> CVar1;
  Alignment AVar2;
  wchar_t wVar3;
  Buffer<char> *pBVar4;
  CharTraits<char> CVar5;
  CharTraits<char> CVar6;
  uint uVar7;
  CharTraits<char> *pCVar8;
  undefined2 *puVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  int in_R9D;
  CharTraits<char> CVar13;
  size_t __len;
  ulong __n;
  size_t __len_1;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  byte bVar17;
  bool bVar18;
  char format [10];
  char in_stack_ffffffffffffff7f;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  uint local_74;
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 auStack_4f [7];
  long local_48;
  ushort uStack_40;
  double local_38;
  
  bVar17 = spec->type_;
  uVar10 = bVar17 - 0x41;
  if (uVar10 < 0x27) {
    if ((0x71UL >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_001427a2;
      goto LAB_0014255e;
    }
    bVar18 = true;
  }
  else {
LAB_001427a2:
    if (bVar17 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff7f,
                 (char *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
    }
    bVar17 = 0x67;
LAB_0014255e:
    bVar18 = false;
  }
  local_38 = (double)value;
  if (0.0 <= local_38) {
    if ((spec->flags_ & 1) == 0) {
      CVar13 = (CharTraits<char>)0x0;
    }
    else {
      CVar13 = (CharTraits<char>)0x2b;
      if ((spec->flags_ & 2) == 0) {
        CVar13 = (CharTraits<char>)0x20;
      }
    }
  }
  else {
    value = -value;
    CVar13 = (CharTraits<char>)0x2d;
  }
  if (NAN(value)) {
    pcVar12 = " nan";
    if (bVar18) {
      pcVar12 = " NAN";
    }
    pcVar11 = " nan";
    if (bVar18) {
      pcVar11 = " NAN";
    }
    pcVar11 = pcVar11 + 1;
    if (CVar13 != (CharTraits<char>)0x0) {
      pcVar11 = pcVar12;
    }
    uVar16 = (ulong)(CVar13 != (CharTraits<char>)0x0);
LAB_00142601:
    pCVar8 = (CharTraits<char> *)write_str<char>(this,pcVar11,uVar16 + 3,&spec->super_AlignSpec);
    if (CVar13 != (CharTraits<char>)0x0) {
      *pCVar8 = CVar13;
    }
    return;
  }
  local_48 = SUB108(value,0);
  uStack_40 = (ushort)((unkuint10)value >> 0x40);
  if ((~uStack_40 & 0x7fff) == 0 && local_48 == -0x8000000000000000) {
    pcVar12 = " inf";
    if (bVar18) {
      pcVar12 = " INF";
    }
    pcVar11 = " inf";
    if (bVar18) {
      pcVar11 = " INF";
    }
    uVar16 = (ulong)(CVar13 != (CharTraits<char>)0x0);
    pcVar11 = pcVar11 + 1;
    if (CVar13 != (CharTraits<char>)0x0) {
      pcVar11 = pcVar12;
    }
    goto LAB_00142601;
  }
  pBVar4 = this->buffer_;
  sVar15 = pBVar4->size_;
  uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (CVar13 != (CharTraits<char>)0x0) {
    if (pBVar4->capacity_ < (uVar10 + (uVar10 == 0)) + sVar15) {
      (**pBVar4->_vptr_Buffer)();
    }
    bVar18 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if (bVar18) {
      uVar10 = 0;
    }
    sVar15 = sVar15 + 1;
  }
  local_52 = 0x25;
  if ((spec->flags_ & 8) == 0) {
    puVar9 = (undefined2 *)local_51;
  }
  else {
    puVar9 = (undefined2 *)(local_51 + 1);
    local_51[0] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_001426ae:
    uVar10 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *(undefined1 *)puVar9 = 0x2d;
      puVar9 = (undefined2 *)((long)puVar9 + 1);
    }
    if (uVar10 == 0) goto LAB_001426ae;
    *(undefined1 *)puVar9 = 0x2a;
    puVar9 = (undefined2 *)((long)puVar9 + 1);
  }
  if (-1 < spec->precision_) {
    *puVar9 = 0x2a2e;
    puVar9 = puVar9 + 1;
  }
  *(undefined1 *)puVar9 = 0x4c;
  *(byte *)((long)puVar9 + 1) = bVar17;
  *(undefined1 *)(puVar9 + 1) = 0;
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  local_74 = 0;
  do {
    pCVar8 = (CharTraits<char> *)(this->buffer_->ptr_ + sVar15);
    uVar7 = internal::CharTraits<char>::format_float<long_double>
                      (pCVar8,(char *)(this->buffer_->capacity_ - sVar15),(size_t)&local_52,
                       (char *)(ulong)uVar10,spec->precision_,in_R9D,value);
    if ((int)uVar7 < 0) {
      pBVar4 = this->buffer_;
      bVar18 = true;
      if (pBVar4->capacity_ != 0xffffffffffffffff) {
        (**pBVar4->_vptr_Buffer)(pBVar4,pBVar4->capacity_ + 1);
      }
    }
    else {
      uVar16 = this->buffer_->capacity_;
      local_74 = uVar7;
      if (uVar7 + sVar15 < uVar16) {
        bVar18 = false;
      }
      else {
        bVar18 = true;
        if (uVar16 < uVar7 + sVar15 + 1) {
          (**this->buffer_->_vptr_Buffer)();
        }
      }
    }
  } while (bVar18);
  CVar5 = SUB41(wVar3,0);
  if (CVar13 == (CharTraits<char>)0x0) {
    CVar13 = (CharTraits<char>)0x0;
    goto LAB_001427dd;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    CVar1 = *pCVar8;
joined_r0x001427cc:
    CVar6 = CVar5;
    if (CVar1 != (CharTraits<char>)0x20) goto LAB_001427d2;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      CVar1 = *pCVar8;
      goto joined_r0x001427cc;
    }
LAB_001427d2:
    CVar6 = CVar13;
    CVar13 = (CharTraits<char>)0x0;
  }
  pCVar8[-1] = CVar6;
  local_74 = local_74 + 1;
LAB_001427dd:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (local_74 < uVar10) {
      pBVar4 = this->buffer_;
      sVar15 = pBVar4->size_;
      uVar16 = sVar15 + uVar10;
      if (pBVar4->capacity_ < uVar16) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar16);
      }
      pBVar4->size_ = uVar16;
      pcVar12 = this->buffer_->ptr_ + sVar15;
      uVar16 = (ulong)local_74;
      memmove(pcVar12 + (uVar10 - local_74 >> 1),pcVar12,uVar16);
      uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar14 = uVar10 - uVar16;
      __n = uVar14 >> 1;
      uVar7 = wVar3 & 0xff;
      if (1 < uVar14) {
        memset(pcVar12,uVar7,__n);
      }
      if (uVar10 == local_74) {
        return;
      }
      memset(pcVar12 + uVar16 + __n,uVar7,uVar14 - __n);
      return;
    }
  }
  if ((CVar13 != (CharTraits<char>)0x0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' '))
  {
    CVar1 = *pCVar8;
    while (CVar1 == (CharTraits<char>)0x20) {
      *pCVar8 = CVar5;
      CVar1 = pCVar8[1];
      pCVar8 = pCVar8 + 1;
    }
    if (CVar13 != (CharTraits<char>)0x0) {
      pCVar8[-1] = CVar13;
    }
  }
  pBVar4 = this->buffer_;
  uVar16 = (ulong)local_74 + pBVar4->size_;
  if (pBVar4->capacity_ < uVar16) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar16);
  }
  pBVar4->size_ = uVar16;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}